

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O0

void vid_ULA(ubyte iobyte)

{
  ubyte uVar1;
  byte bVar2;
  ubyte flashstate;
  ubyte tempbits;
  ubyte iobyte_local;
  
  bVar2 = vid_con_reg & 1;
  vid_con_reg = iobyte;
  if (((iobyte & 2) == 0) && (teletext != '\0')) {
    teletext = '\0';
    pixel_vid_init();
  }
  if (((iobyte & 2) != 0) && (teletext == '\0')) {
    teletext = '\x01';
    teletext_init();
  }
  uVar1 = disp_chars;
  switch(vid_con_reg & 0xc) {
  case 0:
    disp_chars = '\n';
    break;
  case 4:
    disp_chars = '\x14';
    break;
  case 8:
    disp_chars = '(';
    break;
  case 0xc:
    disp_chars = 'P';
  }
  if (uVar1 != disp_chars) {
    set_colour_bits();
  }
  if ((bVar2 != (vid_con_reg & 1)) && (teletext == '\0')) {
    flash();
  }
  return;
}

Assistant:

void vid_ULA(ubyte iobyte)      // Video ULA control register
{
    ubyte tempbits;
    ubyte flashstate;

    flashstate = vid_con_reg & 1;       // initial flash state
    vid_con_reg = iobyte;             // update control register

    if (!(iobyte & 2) && teletext)      // if 1-0 transition on the teletext select
    {                               // initialise graphics
        teletext = 0;
        pixel_vid_init();
    }

    if ((iobyte & 2) && (!teletext))    // if 0-1 transition on the teletext select
    {                               // initialise teletext
        teletext = 1;
        teletext_init();
    }

    tempbits = disp_chars;            // initial number of display characters

    switch (vid_con_reg & 0xC) {
        case 0x00:
            disp_chars = 10;
            break;
        case 0x04:
            disp_chars = 20;
            break;
        case 0x08:
            disp_chars = 40;
            break;
        case 0x0C:
            disp_chars = 80;
            break;
    }

    // if displayed characters change, set_colour_bits()
    if (tempbits != disp_chars) set_colour_bits();
    // if flash state has changed, flash()
    if ((flashstate != (vid_con_reg & 1)) && (!teletext)) flash();

}